

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v10::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> fmt,type args,locale_ref loc)

{
  buffer<char> *last;
  appender out;
  undefined1 value [16];
  undefined1 value_00 [16];
  bool bVar1;
  type tVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> lhs;
  unsigned_long_long uVar3;
  size_t sVar4;
  float value_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar5;
  buffer<char> *end;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> end_00;
  undefined8 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff82;
  buffer<char> *local_78;
  undefined1 local_70 [24];
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_58;
  unsigned_long_long local_50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_48;
  locale_ref local_40;
  writer write;
  
  aVar5 = args.field_1;
  uVar3 = args.desc_;
  sVar4 = fmt.size_;
  lhs.container = (buffer<char> *)fmt.data_;
  if ((sVar4 == 2) && (bVar1 = equal2((char *)lhs.container,"{}"), bVar1)) {
    if ((long)uVar3 < 0) {
      if (((int)(type)args.desc_ < 1) || (tVar2 = (aVar5.args_)->type_, tVar2 == none_type))
      goto LAB_0012f78d;
    }
    else {
      tVar2 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_0012f78d:
        throw_format_error("argument not found");
      }
    }
    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         *(back_insert_iterator<fmt::v10::detail::buffer<char>_> *)&(aVar5.values_)->field_0;
    value_01 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_;
    local_70._0_8_ = buf;
    local_70._8_8_ = uVar3;
    local_70._16_8_ = aVar5;
    local_58.container = (buffer<char> *)loc.locale_;
    switch(tVar2) {
    case int_type:
      write<char,_fmt::v10::appender,_int,_0>((appender)buf,(int)value_01);
      break;
    case uint_type:
      write<char,_fmt::v10::appender,_unsigned_int,_0>((appender)buf,(uint)value_01);
      break;
    case long_long_type:
      write<char,_fmt::v10::appender,_long_long,_0>
                ((appender)buf,
                 (longlong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                );
      break;
    case ulong_long_type:
      write<char,_fmt::v10::appender,_unsigned_long_long,_0>
                ((appender)buf,
                 (unsigned_long_long)
                 out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      break;
    case int128_type:
      value._8_2_ = in_stack_ffffffffffffff80;
      value._0_8_ = in_stack_ffffffffffffff78;
      value._10_6_ = in_stack_ffffffffffffff82;
      write<char,_fmt::v10::appender,___int128,_0>((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      value_00._8_2_ = in_stack_ffffffffffffff80;
      value_00._0_8_ = in_stack_ffffffffffffff78;
      value_00._10_6_ = in_stack_ffffffffffffff82;
      write<char,_fmt::v10::appender,_unsigned___int128,_0>
                ((detail *)buf,out,(unsigned___int128)value_00);
      break;
    case bool_type:
      default_arg_formatter<char>::operator()
                ((default_arg_formatter<char> *)local_70,
                 (bool)((byte)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container & 1));
      break;
    case char_type:
      write<char,fmt::v10::appender>
                ((appender)buf,
                 (byte)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      break;
    case float_type:
      write<char,_fmt::v10::appender,_float,_0>((appender)buf,value_01);
      break;
    case double_type:
      write<char,_fmt::v10::appender,_double,_0>
                ((appender)buf,
                 (double)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      break;
    case last_numeric_type:
      write<char,_fmt::v10::appender,_long_double,_0>
                ((appender)buf,((aVar5.values_)->field_0).long_double_value);
      break;
    case cstring_type:
      write<char,fmt::v10::appender>
                ((appender)buf,
                 (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      break;
    case string_type:
      copy_str_noinline<char,char_const*,fmt::v10::appender>
                ((char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                 (char *)(((aVar5.values_)->field_0).custom.format +
                         (long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container),(appender)buf);
      break;
    case pointer_type:
      default_arg_formatter<char>::operator()
                ((default_arg_formatter<char> *)local_70,
                 (void *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      break;
    case custom_type:
      default_arg_formatter<char>::operator()
                ((default_arg_formatter<char> *)local_70,(handle)((aVar5.values_)->field_0).string);
      break;
    default:
      default_arg_formatter<char>::operator()((default_arg_formatter<char> *)local_70);
    }
  }
  else {
    local_70._16_8_ = (ulong)(uint)local_70._20_4_ << 0x20;
    last = (buffer<char> *)((long)&(lhs.container)->_vptr_buffer + sVar4);
    end_00.container = lhs.container;
    local_40.locale_ = loc.locale_;
    local_48 = aVar5;
    local_50 = uVar3;
    local_58.container = buf;
    local_70._8_8_ = sVar4;
    local_70._0_8_ = lhs.container;
    if ((long)sVar4 < 0x20) {
      while (end = end_00.container, end != last) {
        end_00.container = (buffer<char> *)((long)&end->_vptr_buffer + 1);
        if (*(char *)&end->_vptr_buffer == '}') {
          if ((end_00.container == last) || (*(char *)&(end_00.container)->_vptr_buffer != '}')) {
            throw_format_error("unmatched \'}\' in format string");
          }
          vformat_to<char>::format_handler::on_text
                    ((format_handler *)local_70,(char *)lhs.container,(char *)end_00.container);
          lhs.container = (buffer<char> *)((long)&end->_vptr_buffer + 2);
          end_00.container = lhs.container;
        }
        else if (*(char *)&end->_vptr_buffer == '{') {
          vformat_to<char>::format_handler::on_text
                    ((format_handler *)local_70,(char *)lhs.container,(char *)end);
          lhs.container =
               (buffer<char> *)
               parse_replacement_field<char,fmt::v10::detail::vformat_to<char>(fmt::v10::detail::buffer<char>&,fmt::v10::basic_string_view<char>,fmt::v10::detail::vformat_args<char>::type,fmt::v10::detail::locale_ref)::format_handler&>
                         (end,(char *)last,(format_handler *)local_70);
          end_00.container = lhs.container;
        }
      }
      vformat_to<char>::format_handler::on_text
                ((format_handler *)local_70,(char *)lhs.container,(char *)last);
    }
    else {
      write.handler_ = (format_handler *)local_70;
      while (lhs.container != last) {
        local_78 = lhs.container;
        if ((*(char *)&(lhs.container)->_vptr_buffer != '{') &&
           (bVar1 = find<false,char,char_const*>
                              ((char *)((long)&(lhs.container)->_vptr_buffer + 1),(char *)last,'{',
                               (char **)&local_78), !bVar1)) {
          parse_format_string<false,_char,_format_handler>::writer::operator()
                    (&write,(char *)lhs.container,(char *)last);
          return;
        }
        parse_format_string<false,_char,_format_handler>::writer::operator()
                  (&write,(char *)lhs.container,(char *)local_78);
        lhs.container =
             (buffer<char> *)
             parse_replacement_field<char,fmt::v10::detail::vformat_to<char>(fmt::v10::detail::buffer<char>&,fmt::v10::basic_string_view<char>,fmt::v10::detail::vformat_args<char>::type,fmt::v10::detail::locale_ref)::format_handler&>
                       (local_78,(char *)last,(format_handler *)local_70);
      }
    }
  }
  return;
}

Assistant:

void vformat_to(buffer<Char>& buf, basic_string_view<Char> fmt,
                typename vformat_args<Char>::type args, locale_ref loc) {
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) throw_format_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> p_out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> p_args,
                   locale_ref p_loc)
        : parse_context(str), context(p_out, p_args, p_loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) throw_format_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      // Not using a visitor for custom types gives better codegen.
      if (arg.format_custom(begin, parse_context, context))
        return parse_context.begin();
      auto specs = detail::dynamic_format_specs<Char>();
      begin = parse_format_specs(begin, end, specs, parse_context, arg.type());
      detail::handle_dynamic_spec<detail::width_checker>(
          specs.width, specs.width_ref, context);
      detail::handle_dynamic_spec<detail::precision_checker>(
          specs.precision, specs.precision_ref, context);
      if (begin == end || *begin != '}')
        throw_format_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}